

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture2DView *src,float *texCoord,ReferenceParams *params)

{
  Vec3 *w;
  float fVar1;
  int iVar2;
  int iVar3;
  LodMode mode;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar8;
  int x_00;
  ConstPixelBufferAccess *pCVar9;
  int y;
  int iVar10;
  int x;
  int iVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float dudy;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 extraout_XMM0 [16];
  float width;
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  Texture2DView TVar31;
  Vec4 tq;
  Vec4 sq;
  Vec3 triT [2];
  Vec3 triS [2];
  Texture2DView src_1;
  Vec4 uq;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture2DView view;
  Texture2DView src_2;
  Vec4 vq;
  float local_1f8;
  undefined4 uStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e0;
  Vector<float,_4> local_188;
  Vector<float,_4> local_178;
  Vec3 local_168;
  Vec3 VStack_15c;
  Vec3 local_148;
  Vec3 VStack_13c;
  Texture2DView local_128;
  undefined8 local_118;
  IVec2 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_f8;
  Vec4 *local_d8;
  Vec4 *local_d0;
  Texture2DView local_c8;
  Texture2DView local_b8;
  IVec2 local_a8;
  float fStack_a0;
  undefined4 uStack_9c;
  ulong local_98 [2];
  Vec3 local_88;
  float fStack_7c;
  undefined8 local_78;
  Vec3 local_68;
  undefined4 uStack_5c;
  undefined8 local_58;
  TextureTestUtil local_50 [16];
  tcu local_40 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  TVar31 = getSubView(src,params->baseLevel,params->maxLevel);
  local_c8.m_levels = TVar31.m_levels;
  local_c8.m_numLevels = TVar31.m_numLevels;
  fVar29 = *texCoord;
  fVar14 = texCoord[2];
  fVar15 = texCoord[4];
  fVar26 = texCoord[6];
  fVar1 = texCoord[1];
  fVar30 = texCoord[3];
  fVar16 = texCoord[5];
  fVar17 = texCoord[7];
  local_188.m_data[0] = fVar1;
  local_188.m_data[1] = fVar30;
  local_188.m_data[2] = fVar16;
  local_188.m_data[3] = fVar17;
  local_178.m_data[0] = fVar29;
  local_178.m_data[1] = fVar14;
  local_178.m_data[2] = fVar15;
  local_178.m_data[3] = fVar26;
  if (((params->super_RenderParams).flags & 1) == 0) {
    local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar31 = tcu::getEffectiveTextureView
                       (&local_c8,
                        (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)&local_f8,&params->sampler);
    local_128.m_levels = TVar31.m_levels;
    local_128.m_numLevels = TVar31.m_numLevels;
    fVar18 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      fVar18 = (params->super_RenderParams).bias;
    }
    local_108.m_data[0] = dst->m_width;
    local_108.m_data[1] = dst->m_height;
    if (local_128.m_numLevels < 1) {
      local_a8.m_data[0] = 0;
      local_a8.m_data[1] = 0;
    }
    else {
      local_a8.m_data = *(int (*) [2])((local_128.m_levels)->m_size).m_data;
    }
    VStack_13c.m_data[2] = fVar14;
    VStack_13c.m_data[1] = fVar15;
    VStack_15c.m_data[2] = fVar30;
    VStack_15c.m_data[1] = fVar16;
    local_168.m_data[0] = fVar1;
    local_168.m_data[1] = fVar30;
    local_168.m_data[2] = fVar16;
    VStack_15c.m_data[0] = fVar17;
    local_148.m_data[0] = fVar29;
    local_148.m_data[1] = fVar14;
    local_148.m_data[2] = fVar15;
    VStack_13c.m_data[0] = fVar26;
    fVar14 = computeNonProjectedTriLod(params->lodMode,&local_108,&local_a8,&local_148,&local_168);
    uVar5 = params->minLod;
    uVar6 = params->baseLevel;
    uVar7 = params->maxLevel;
    fVar29 = params->maxLod;
    fVar15 = computeNonProjectedTriLod(params->lodMode,&local_108,&local_a8,&VStack_13c,&VStack_15c)
    ;
    auVar27._4_4_ = params->maxLod;
    auVar27._0_4_ = fVar29;
    auVar27._8_8_ = 0;
    auVar28._4_4_ = fVar15 + fVar18;
    auVar28._0_4_ = fVar14 + fVar18;
    auVar28._8_4_ = extraout_XMM0_Db + fVar18;
    auVar28._12_4_ = extraout_XMM0_Db_00 + fVar18;
    auVar28 = minps(auVar27,auVar28);
    uVar12 = -(uint)(fVar14 + fVar18 < (float)uVar5);
    uVar13 = -(uint)(fVar15 + fVar18 < params->minLod);
    auVar19._0_8_ = CONCAT44((uint)params->minLod & uVar13,uVar5 & uVar12);
    auVar19._8_4_ = uVar6 & -(uint)(extraout_XMM0_Db + fVar18 < (float)uVar6);
    auVar19._12_4_ = uVar7 & -(uint)(extraout_XMM0_Db_00 + fVar18 < (float)uVar7);
    local_98[0] = CONCAT44(~uVar13 & auVar28._4_4_,~uVar12 & auVar28._0_4_) | auVar19._0_8_;
    for (iVar10 = 0; iVar10 < dst->m_height; iVar10 = iVar10 + 1) {
      auVar20._4_12_ = auVar19._4_12_;
      auVar20._0_4_ = (float)iVar10 + 0.5;
      auVar28 = auVar20;
      for (iVar11 = 0; iVar11 < dst->m_width; iVar11 = iVar11 + 1) {
        auVar21._4_12_ = auVar28._4_12_;
        auVar21._0_4_ = (float)iVar11 + 0.5;
        uStack_1f4 = auVar19._4_4_;
        auVar23._12_4_ = auVar28._12_4_;
        auVar23._0_8_ = auVar21._0_8_;
        auVar23._8_4_ = auVar28._4_4_;
        auVar22._8_8_ = auVar23._8_8_;
        auVar22._4_4_ = auVar20._0_4_;
        auVar22._0_4_ = auVar21._0_4_;
        auVar24._0_12_ = auVar22._0_12_;
        auVar24._12_4_ = uStack_1f4;
        auVar25._0_4_ = (float)dst->m_width;
        auVar25._4_4_ = (float)dst->m_height;
        auVar25._8_8_ = 0;
        auVar28 = divps(auVar24,auVar25);
        fVar29 = auVar28._4_4_;
        bVar4 = 1.0 <= auVar28._0_4_ + fVar29;
        if (bVar4) {
          auVar28 = ZEXT416((uint)(1.0 - auVar28._0_4_));
          if (!bVar4) goto LAB_008a377c;
LAB_008a376d:
          fVar14 = auVar28._0_4_;
          fVar29 = 1.0 - fVar29;
        }
        else {
          if (bVar4) goto LAB_008a376d;
LAB_008a377c:
          fVar14 = auVar28._0_4_;
        }
        uVar8 = (ulong)bVar4;
        fVar15 = (&local_148)[uVar8].m_data[0];
        fVar26 = (&local_168)[uVar8].m_data[0];
        execSample((TextureTestUtil *)&local_b8,&local_128,params,
                   ((&local_148)[uVar8].m_data[1] - fVar15) * fVar29 +
                   ((&VStack_13c)[uVar8 - 1].m_data[2] - fVar15) * fVar14 + fVar15,
                   ((&local_168)[uVar8].m_data[1] - fVar26) * fVar29 +
                   ((&VStack_15c)[uVar8 - 1].m_data[2] - fVar26) * fVar14 + fVar26,
                   *(float *)((long)local_98 + uVar8 * 4));
        tcu::operator*((tcu *)&local_88,(Vector<float,_4> *)&local_b8,
                       &(params->super_RenderParams).colorScale);
        tcu::operator+((tcu *)&local_68,(Vector<float,_4> *)&local_88,
                       &(params->super_RenderParams).colorBias);
        tcu::SurfaceAccess::setPixel(dst,(Vec4 *)&local_68,iVar11,iVar10);
        auVar28 = extraout_XMM0;
      }
      auVar19 = auVar28;
    }
  }
  else {
    local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVar31 = tcu::getEffectiveTextureView
                       (&local_c8,
                        (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         *)&local_f8,&params->sampler);
    pCVar9 = TVar31.m_levels;
    iVar10 = TVar31.m_numLevels;
    fVar29 = 0.0;
    local_1e0 = 0.0;
    if (((params->super_RenderParams).flags & 2) != 0) {
      local_1e0 = (params->super_RenderParams).bias;
    }
    if (0 < iVar10) {
      fVar29 = (float)(pCVar9->m_size).m_data[0];
    }
    iVar11 = dst->m_width;
    iVar2 = dst->m_height;
    local_b8.m_numLevels = iVar10;
    local_b8.m_levels = pCVar9;
    tcu::operator*((tcu *)&local_108,fVar29,&local_178);
    if (iVar10 < 1) {
      fVar29 = 0.0;
    }
    else {
      fVar29 = (float)(pCVar9->m_size).m_data[1];
    }
    tcu::operator*((tcu *)&local_a8,fVar29,&local_188);
    local_148.m_data[0] = local_178.m_data[0];
    local_148.m_data[1] = local_178.m_data[1];
    local_148.m_data[2] = local_178.m_data[2];
    VStack_13c.m_data[0] = local_178.m_data[3];
    VStack_13c.m_data[2] = local_178.m_data[1];
    VStack_13c.m_data[1] = local_178.m_data[2];
    local_168.m_data[0] = local_188.m_data[0];
    local_168.m_data[1] = local_188.m_data[1];
    local_168.m_data[2] = local_188.m_data[2];
    VStack_15c.m_data[0] = local_188.m_data[3];
    VStack_15c.m_data[2] = local_188.m_data[1];
    VStack_15c.m_data[1] = local_188.m_data[2];
    local_128.m_numLevels = local_108.m_data[0];
    local_128._4_4_ = local_108.m_data[1];
    local_128.m_levels = (ConstPixelBufferAccess *)CONCAT44(uStack_fc,uStack_100);
    local_118 = CONCAT44(local_108.m_data[1],uStack_100);
    local_68.m_data[0] = (float)local_a8.m_data[0];
    local_68.m_data[1] = (float)local_a8.m_data[1];
    local_68.m_data[2] = fStack_a0;
    uStack_5c = uStack_9c;
    local_58 = CONCAT44(local_a8.m_data[1],fStack_a0);
    local_88.m_data[0] = (params->super_RenderParams).w.m_data[0];
    local_88.m_data[1] = (params->super_RenderParams).w.m_data[1];
    local_88.m_data[2] = (params->super_RenderParams).w.m_data[2];
    fStack_7c = (params->super_RenderParams).w.m_data[3];
    local_78 = CONCAT44(local_88.m_data[1],local_88.m_data[2]);
    local_d0 = &(params->super_RenderParams).colorScale;
    local_d8 = &(params->super_RenderParams).colorBias;
    for (iVar10 = 0; iVar10 < dst->m_height; iVar10 = iVar10 + 1) {
      fVar29 = (float)iVar10 + 0.5;
      fVar14 = fVar29 / (float)iVar2;
      for (x_00 = 0; iVar3 = dst->m_width, x_00 < iVar3; x_00 = x_00 + 1) {
        fVar26 = (float)x_00 + 0.5;
        fVar30 = fVar26 / (float)iVar11;
        bVar4 = 1.0 <= fVar14 + fVar30;
        fVar15 = fVar14;
        fVar1 = fVar29;
        if (bVar4) {
          fVar26 = (float)iVar11 - fVar26;
          fVar30 = 1.0 - fVar30;
          fVar15 = 1.0 - fVar14;
          fVar1 = (float)iVar2 - fVar29;
        }
        uVar8 = (ulong)bVar4;
        w = &local_88 + uVar8;
        fVar16 = projectedTriInterpolate(&local_148 + uVar8,w,fVar30,fVar15);
        fVar15 = projectedTriInterpolate(&local_168 + uVar8,w,fVar30,fVar15);
        width = (float)iVar3;
        mode = params->lodMode;
        fVar30 = (float)dst->m_height;
        fVar17 = triDerivateX((Vec3 *)(&local_128.m_numLevels + uVar8 * 3),w,fVar26,width,
                              fVar1 / fVar30);
        fVar18 = triDerivateX(&local_68 + uVar8,w,fVar26,width,fVar1 / fVar30);
        dudy = triDerivateY((Vec3 *)(&local_128.m_numLevels + uVar8 * 3),w,fVar1,fVar30,
                            fVar26 / width);
        fVar26 = triDerivateY(&local_68 + uVar8,w,fVar1,fVar30,fVar26 / width);
        fVar26 = computeLodFromDerivates(mode,fVar17,fVar18,dudy,fVar26);
        execSample(local_50,&local_b8,params,fVar16,fVar15,fVar26 + local_1e0);
        tcu::operator*(local_40,(Vector<float,_4> *)local_50,local_d0);
        tcu::operator+((tcu *)local_98,(Vector<float,_4> *)local_40,local_d8);
        tcu::SurfaceAccess::setPixel(dst,(Vec4 *)local_98,x_00,iVar10);
      }
    }
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&local_f8);
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture2DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture2DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, tq, params);
	else
		sampleTextureNonProjected(dst, view, sq, tq, params);
}